

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_platform.cpp
# Opt level: O2

void __thiscall MppPlatformService::MppPlatformService(MppPlatformService *this)

{
  RK_U32 *codec_type;
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  MppSocInfo *pMVar5;
  FILE *__stream;
  size_t sVar6;
  MppClientType client_type;
  uint uVar7;
  RK_S32 minor;
  RK_S32 major;
  char buf [32];
  
  this->ioctl_version = IOCTL_MPP_SERVICE_V1;
  this->kernel_version = KERNEL_UNKNOWN;
  this->vcodec_type = 0;
  this->soc_info = (MppSocInfo *)0x0;
  this->soc_name = (char *)0x0;
  (this->mpp_service_cmd_cap).support_cmd = 0;
  (this->mpp_service_cmd_cap).query_cmd = 1;
  (this->mpp_service_cmd_cap).init_cmd = 0x101;
  (this->mpp_service_cmd_cap).send_cmd = 0x201;
  (this->mpp_service_cmd_cap).poll_cmd = 0x301;
  (this->mpp_service_cmd_cap).ctrl_cmd = 0x400;
  mpp_env_get_u32("mpp_debug",&mpp_debug,0);
  pcVar4 = mpp_get_soc_name();
  this->soc_name = pcVar4;
  pMVar5 = mpp_get_soc_info();
  this->soc_info = pMVar5;
  if (pMVar5->soc_type == ROCKCHIP_SOC_AUTO) {
    _mpp_log_l(4,"mpp_platform","can not found match soc name: %s\n",(char *)0x0,this->soc_name);
  }
  codec_type = &this->vcodec_type;
  this->ioctl_version = IOCTL_VCODEC_SERVICE;
  pcVar4 = mpp_get_mpp_service_name();
  if (pcVar4 != (char *)0x0) {
    this->ioctl_version = IOCTL_MPP_SERVICE_V1;
    check_mpp_service_cap(codec_type,this->hw_ids,&this->mpp_service_cmd_cap);
    if (((byte)mpp_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_platform","vcodec_type from kernel 0x%08x, vs from soc info 0x%08x\n",
                 (char *)0x0,(ulong)*codec_type,(ulong)this->soc_info->vcodec_type);
    }
  }
  iVar3 = access("/proc/version",4);
  if ((iVar3 == 0) && (__stream = fopen("/proc/version","rb"), __stream != (FILE *)0x0)) {
    sVar6 = fread(buf,1,0x1f,__stream);
    buf[sVar6] = '\0';
    pcVar4 = strstr(buf,"Linux version ");
    if (pcVar4 != (char *)0x0) {
      major = 0;
      __isoc99_sscanf(pcVar4 + 0xe,"%d.%d.%d ",&major);
    }
    fclose(__stream);
  }
  this->kernel_version = KERNEL_UNKNOWN;
  uVar1 = this->vcodec_type;
  uVar2 = this->soc_info->vcodec_type;
  if (uVar1 == 0) {
    *codec_type = uVar2;
  }
  else {
    for (uVar7 = 0; uVar7 != 0x19; uVar7 = uVar7 + 1) {
      if (((uVar2 ^ uVar1) >> (uVar7 & 0x1f) & 1) != 0) {
        if (((byte)mpp_debug & 0x10) != 0) {
          _mpp_log_l(4,"mpp_platform","confliction found at client_type %d\n",(char *)0x0,
                     (ulong)uVar7);
        }
        if ((this->soc_info->vcodec_type & 1 << ((byte)uVar7 & 0x1f)) == 0) {
          if (((byte)mpp_debug & 0x10) != 0) {
            _mpp_log_l(4,"mpp_platform","client %d driver is ready but not declared!\n",(char *)0x0,
                       (ulong)uVar7);
          }
          if (uVar7 == 3) {
            *(byte *)codec_type = (byte)*codec_type & 0xf7;
          }
        }
        else {
          _mpp_log_l(2,"mpp_platform","client %d driver is not ready!\n",(char *)0x0,(ulong)uVar7);
        }
      }
    }
    if (((byte)mpp_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_platform","vcode_type 0x%08x\n",(char *)0x0,(ulong)*codec_type);
    }
  }
  return;
}

Assistant:

MppPlatformService::MppPlatformService()
    : ioctl_version(IOCTL_MPP_SERVICE_V1),
      kernel_version(KERNEL_UNKNOWN),
      vcodec_type(0),
      soc_info(NULL),
      soc_name(NULL)
{
    /* judge vdpu support version */
    MppServiceCmdCap *cap = &mpp_service_cmd_cap;

    /* default value */
    cap->support_cmd = 0;
    cap->query_cmd = MPP_CMD_QUERY_BASE + 1;
    cap->init_cmd = MPP_CMD_INIT_BASE + 1;
    cap->send_cmd = MPP_CMD_SEND_BASE + 1;
    cap->poll_cmd = MPP_CMD_POLL_BASE + 1;
    cap->ctrl_cmd = MPP_CMD_CONTROL_BASE + 0;

    mpp_env_get_u32("mpp_debug", &mpp_debug, 0);

    /* read soc name */
    soc_name = mpp_get_soc_name();
    soc_info = mpp_get_soc_info();

    if (soc_info->soc_type == ROCKCHIP_SOC_AUTO)
        mpp_log("can not found match soc name: %s\n", soc_name);

    ioctl_version = IOCTL_VCODEC_SERVICE;
    if (mpp_get_mpp_service_name()) {
        ioctl_version = IOCTL_MPP_SERVICE_V1;
        check_mpp_service_cap(&vcodec_type, hw_ids, cap);
        mpp_dbg_platform("vcodec_type from kernel 0x%08x, vs from soc info 0x%08x\n",
                         vcodec_type, soc_info->vcodec_type);
    }
    kernel_version = check_kernel_version();
    if (!vcodec_type) {
        vcodec_type = soc_info->vcodec_type;
    } else {
        // Compare kernel result with soc infomation.
        RK_U32 diff_type = vcodec_type ^ soc_info->vcodec_type;
        RK_U32 i;

        for (i = 0; i <= VPU_CLIENT_VEPU22; i++) {
            RK_U32 mask = 1 << i;

            if (diff_type & mask) {
                MppClientType client_type = (MppClientType) i;

                mpp_dbg_platform("confliction found at client_type %d\n", client_type);

                if (soc_info->vcodec_type & mask) {
                    mpp_err("client %d driver is not ready!\n", client_type);
                } else {
                    mpp_dbg_platform("client %d driver is ready but not declared!\n", client_type);
                    if (client_type == VPU_CLIENT_VDPU2_PP)
                        vcodec_type &= ~mask;
                }
            }
        }

        mpp_dbg_platform("vcode_type 0x%08x\n", vcodec_type);
    }
}